

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.h
# Opt level: O0

void sat_solver_bookmark(sat_solver *s)

{
  sat_solver *s_local;
  
  if (s->qhead == s->qtail) {
    s->iVarPivot = s->size;
    s->iTrailPivot = s->qhead;
    Sat_MemBookMark(&s->Mem);
    if (s->activity2 != (word *)0x0) {
      s->var_inc2 = s->var_inc;
      memcpy(s->activity2,s->activity,(long)s->iVarPivot << 3);
    }
    return;
  }
  __assert_fail("s->qhead == s->qtail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                ,0x137,"void sat_solver_bookmark(sat_solver *)");
}

Assistant:

static inline void sat_solver_bookmark(sat_solver* s)
{
    assert( s->qhead == s->qtail );
    s->iVarPivot    = s->size;
    s->iTrailPivot  = s->qhead;
    Sat_MemBookMark( &s->Mem );
    if ( s->activity2 )
    {
        s->var_inc2 = s->var_inc;
        memcpy( s->activity2, s->activity, sizeof(word) * s->iVarPivot );
    }
}